

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini_processing.cpp
# Opt level: O2

void __thiscall IniProcessing::IniProcessing(IniProcessing *this,IniProcessing *ip)

{
  bool bVar1;
  undefined3 uVar2;
  int iVar3;
  
  std::__cxx11::string::string((string *)this,(string *)ip);
  bVar1 = (ip->m_params).opened;
  uVar2 = *(undefined3 *)&(ip->m_params).field_0x21;
  iVar3 = (ip->m_params).lineWithError;
  *(undefined8 *)((long)&(this->m_params).lineWithError + 1) =
       *(undefined8 *)((long)&(ip->m_params).lineWithError + 1);
  (this->m_params).opened = bVar1;
  *(undefined3 *)&(this->m_params).field_0x21 = uVar2;
  (this->m_params).lineWithError = iVar3;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&(this->m_params).iniData._M_h,&(ip->m_params).iniData._M_h);
  (this->m_params).currentGroup = (ip->m_params).currentGroup;
  std::__cxx11::string::string
            ((string *)&(this->m_params).currentGroupName,(string *)&(ip->m_params).currentGroupName
            );
  return;
}

Assistant:

IniProcessing::IniProcessing(const IniProcessing &ip) :
    m_params(ip.m_params)
{}